

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86.cpp
# Opt level: O0

Layer * ncnn::Convolution_x86_layer_creator(void)

{
  long *plVar1;
  undefined8 local_20;
  Convolution_x86 *in_stack_fffffffffffffff0;
  
  plVar1 = (long *)operator_new(0x2c8);
  Convolution_x86::Convolution_x86(in_stack_fffffffffffffff0);
  local_20 = (Layer *)0x0;
  if (plVar1 != (long *)0x0) {
    local_20 = (Layer *)((long)plVar1 + *(long *)(*plVar1 + -0x18));
  }
  return local_20;
}

Assistant:

Convolution_x86::Convolution_x86()
{
    activation = 0;
}